

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtreeview_p.h
# Opt level: O2

bool __thiscall QTreeViewPrivate::isItemHiddenOrDisabled(QTreeViewPrivate *this,int i)

{
  QTreeViewItem *pQVar1;
  QAbstractItemModel *pQVar2;
  bool bVar3;
  ulong uVar4;
  long in_FS_OFFSET;
  bool bVar5;
  QModelIndex local_28;
  long local_10;
  
  local_10 = *(long *)(in_FS_OFFSET + 0x28);
  if ((i < 0) || (uVar4 = (ulong)(uint)i, (ulong)(this->viewItems).d.size <= uVar4)) {
    bVar5 = false;
  }
  else {
    pQVar1 = (this->viewItems).d.ptr;
    local_28.m.ptr = pQVar1[uVar4].index.m.ptr;
    pQVar1 = pQVar1 + uVar4;
    local_28.r = (pQVar1->index).r;
    local_28.c = (pQVar1->index).c;
    local_28.i = (pQVar1->index).i;
    bVar3 = isRowHidden(this,&local_28);
    bVar5 = true;
    if (!bVar3) {
      pQVar2 = (this->super_QAbstractItemViewPrivate).model;
      uVar4 = (**(code **)(*(long *)pQVar2 + 0x138))(pQVar2,&local_28);
      bVar5 = (uVar4 & 0x20) == 0;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
    return bVar5;
  }
  __stack_chk_fail();
}

Assistant:

inline bool isItemHiddenOrDisabled(int i) const {
        if (i < 0 || i >= viewItems.size())
            return false;
        const QModelIndex index = viewItems.at(i).index;
        return isRowHidden(index) || !isIndexEnabled(index);
    }